

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_pyramid.h
# Opt level: O1

void gimage::expandGauss<unsigned_short,unsigned_short>
               (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *target,
               Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image)

{
  long i_00;
  long i_01;
  long lVar1;
  long lVar2;
  long h;
  long lVar3;
  int j;
  long lVar4;
  long lVar5;
  long lVar6;
  long w;
  unsigned_short *puVar7;
  long i;
  long lVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  
  lVar1 = image->width;
  lVar2 = image->height;
  w = lVar1 * 2;
  h = lVar2 * 2;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
            (target,w,h,(long)image->depth);
  if (0 < target->depth) {
    lVar3 = h + -2;
    i_00 = w + -2;
    i_01 = w + -1;
    lVar9 = 0;
    lVar4 = 0;
    if (0 < lVar3) {
      lVar4 = lVar3;
    }
    if (w < 2) {
      w = 1;
    }
    lVar5 = 3;
    if (3 < i_00) {
      lVar5 = i_00;
    }
    lVar6 = 3;
    if (3 < lVar3) {
      lVar6 = lVar3;
    }
    do {
      puVar7 = *target->img[lVar9];
      j = (int)lVar9;
      if (0 < lVar2) {
        lVar3 = 0;
        do {
          if (0 < lVar1) {
            lVar10 = 0;
            lVar8 = 0;
            do {
              fVar11 = expandGaussPixel<unsigned_short>(image,lVar8,lVar3,j);
              puVar7[lVar8] = (unsigned_short)(int)fVar11;
              lVar8 = lVar8 + 1;
              lVar10 = lVar10 + -2;
            } while (w != lVar8);
            puVar7 = (unsigned_short *)((long)puVar7 - lVar10);
          }
        } while ((lVar3 == 0) && (lVar3 = 1, 1 < h));
      }
      if (2 < lVar2) {
        lVar3 = 2;
        do {
          if (0 < lVar1) {
            fVar11 = expandGaussPixel<unsigned_short>(image,0,lVar3,j);
            *puVar7 = (unsigned_short)(int)fVar11;
            fVar11 = expandGaussPixel<unsigned_short>(image,1,lVar3,j);
            puVar7[1] = (unsigned_short)(int)fVar11;
            puVar7 = puVar7 + 2;
          }
          if (2 < lVar1) {
            lVar8 = 2;
            lVar10 = 0;
            do {
              fVar11 = expandGaussPixelInner<unsigned_short>(image,lVar8,lVar3,j);
              puVar7[lVar8 + -2] = (unsigned_short)(int)fVar11;
              lVar8 = lVar8 + 1;
              lVar10 = lVar10 + -2;
            } while (lVar5 != lVar8);
            puVar7 = (unsigned_short *)((long)puVar7 - lVar10);
          }
          if (1 < lVar1) {
            fVar11 = expandGaussPixel<unsigned_short>(image,i_00,lVar3,j);
            *puVar7 = (unsigned_short)(int)fVar11;
            fVar11 = expandGaussPixel<unsigned_short>(image,i_01,lVar3,j);
            puVar7[1] = (unsigned_short)(int)fVar11;
            puVar7 = puVar7 + 2;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 != lVar6);
      }
      lVar3 = lVar4;
      if (0 < lVar2) {
        do {
          if (0 < lVar1) {
            lVar10 = 0;
            lVar8 = 0;
            do {
              fVar11 = expandGaussPixel<unsigned_short>(image,lVar8,lVar3,j);
              puVar7[lVar8] = (unsigned_short)(int)fVar11;
              lVar8 = lVar8 + 1;
              lVar10 = lVar10 + -2;
            } while (w != lVar8);
            puVar7 = (unsigned_short *)((long)puVar7 - lVar10);
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < h);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < target->depth);
  }
  return;
}

Assistant:

void expandGauss(Image<T> &target, const Image<S> &image)
{
  const long w=2*image.getWidth();
  const long h=2*image.getHeight();

  target.setSize(w, h, image.getDepth());

  // for all color channels

  for (int d=0; d<target.getDepth(); d++)
  {
    T *p=target.getPtr(0, 0, d);
    for (long k=0; k<2 && k<h; k++)
    {
      for (long i=0; i<w; i++)
      {
        *p++=static_cast<T>(expandGaussPixel(image, i, k, d));
      }
    }

    for (long k=2; k<h-2; k++)
    {
      if (w > 0) *p++=static_cast<T>(expandGaussPixel(image, 0, k, d));
      if (w > 1) *p++=static_cast<T>(expandGaussPixel(image, 1, k, d));

      for (long i=2; i<w-2; i++)
      {
        *p++=static_cast<T>(expandGaussPixelInner(image, i, k, d));
      }

      if (w > 2) *p++=static_cast<T>(expandGaussPixel(image, w-2, k, d));
      if (w > 3) *p++=static_cast<T>(expandGaussPixel(image, w-1, k, d));
    }

    for (long k=std::max(0l, h-2); k<h; k++)
    {
      for (long i=0; i<w; i++)
      {
        *p++=static_cast<T>(expandGaussPixel(image, i, k, d));
      }
    }
  }
}